

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

void __thiscall
QVariant::setValue<QIBusAttribute_const&,void>(QVariant *this,QIBusAttribute *avalue)

{
  bool bVar1;
  QIBusAttribute *in_RSI;
  QIBusAttribute *in_RDI;
  long in_FS_OFFSET;
  QMetaType metaType;
  QIBusAttribute *in_stack_ffffffffffffff98;
  QVariant *in_stack_ffffffffffffffa0;
  bool local_49;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaType::fromType<QIBusAttribute>();
  bVar1 = isDetached(in_stack_ffffffffffffffa0);
  local_49 = false;
  if (bVar1) {
    Private::type(&in_stack_ffffffffffffffa0->d);
    local_49 = operator==((QMetaType *)in_stack_ffffffffffffffa0,
                          (QMetaType *)in_stack_ffffffffffffff98);
  }
  if (local_49 == false) {
    fromValue<QIBusAttribute>(in_RDI);
    operator=((QVariant *)in_RDI,in_stack_ffffffffffffffa0);
    ::QVariant::~QVariant(&local_28);
  }
  else {
    constData((QVariant *)0x131689);
    QIBusAttribute::operator=(in_RSI,in_stack_ffffffffffffff98);
    (in_RDI->super_QIBusSerializable).attachments.d =
         (Data *)((ulong)(in_RDI->super_QIBusSerializable).attachments.d & 0xfffffffffffffffd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void setValue(T &&avalue)
    {
        using VT = std::decay_t<T>;
        QMetaType metaType = QMetaType::fromType<VT>();
        // If possible we reuse the current QVariant private.
        if (isDetached() && d.type() == metaType) {
            *reinterpret_cast<VT *>(const_cast<void *>(constData())) = std::forward<T>(avalue);
            d.is_null = false;
        } else {
            *this = QVariant::fromValue<VT>(std::forward<T>(avalue));
        }
    }